

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

string * __thiscall
pbrt::BoxFilter::ToString_abi_cxx11_(string *__return_storage_ptr__,BoxFilter *this)

{
  Vector2<float> *in_RCX;
  
  StringPrintf<pbrt::Vector2<float>const&>
            (__return_storage_ptr__,(pbrt *)"[ BoxFilter radius: %s ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string BoxFilter::ToString() const {
    return StringPrintf("[ BoxFilter radius: %s ]", radius);
}